

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

int Abc_NtkVerifyCex(Abc_Ntk_t *pNtk,Abc_Cex_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *pAVar8;
  int local_30;
  int local_2c;
  int iBit;
  int k;
  int i;
  int RetValue;
  Abc_Obj_t *pObj;
  Abc_Cex_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  local_30 = 0;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLatch.c"
                  ,0x2df,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  iVar1 = p->nPis;
  iVar2 = Abc_NtkPiNum(pNtk);
  if (iVar1 != iVar2) {
    __assert_fail("p->nPis == Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLatch.c"
                  ,0x2e0,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  Abc_NtkCleanMarkC(pNtk);
  pAVar7 = Abc_AigConst1(pNtk);
  *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffbf | 0x40;
  for (iBit = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), iBit < iVar1; iBit = iBit + 1) {
    pAVar7 = Abc_NtkBox(pNtk,iBit);
    iVar1 = Abc_ObjIsLatch(pAVar7);
    if (iVar1 != 0) {
      uVar3 = Abc_InfoHasBit((uint *)(p + 1),local_30);
      pAVar7 = Abc_ObjFanout0(pAVar7);
      *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffbf | (uVar3 & 1) << 6;
      local_30 = local_30 + 1;
    }
  }
  local_30 = p->nRegs;
  for (iBit = 0; iBit <= p->iFrame; iBit = iBit + 1) {
    for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar7 = Abc_NtkPi(pNtk,local_2c);
      uVar3 = Abc_InfoHasBit((uint *)(p + 1),local_30);
      *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xffffffbf | (uVar3 & 1) << 6;
      local_30 = local_30 + 1;
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar7 = Abc_NtkObj(pNtk,local_2c);
      if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar7), iVar1 != 0)) {
        pAVar8 = Abc_ObjFanin0(pAVar7);
        uVar3 = *(uint *)&pAVar8->field_0x14;
        uVar4 = Abc_ObjFaninC0(pAVar7);
        pAVar8 = Abc_ObjFanin1(pAVar7);
        uVar6 = *(uint *)&pAVar8->field_0x14;
        uVar5 = Abc_ObjFaninC1(pAVar7);
        *(uint *)&pAVar7->field_0x14 =
             *(uint *)&pAVar7->field_0x14 & 0xffffffbf |
             ((uVar3 >> 6 & 1 ^ uVar4) & (uVar6 >> 6 & 1 ^ uVar5) & 1) << 6;
      }
    }
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar7 = Abc_NtkCo(pNtk,local_2c);
      pAVar8 = Abc_ObjFanin0(pAVar7);
      uVar3 = *(uint *)&pAVar8->field_0x14;
      uVar6 = Abc_ObjFaninC0(pAVar7);
      *(uint *)&pAVar7->field_0x14 =
           *(uint *)&pAVar7->field_0x14 & 0xffffffbf | ((uVar3 >> 6 & 1 ^ uVar6) & 1) << 6;
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar7 = Abc_NtkBox(pNtk,local_2c);
      iVar1 = Abc_ObjIsLatch(pAVar7);
      if (iVar1 != 0) {
        pAVar8 = Abc_ObjFanin0(pAVar7);
        uVar3 = *(uint *)&pAVar8->field_0x14;
        pAVar7 = Abc_ObjFanout0(pAVar7);
        *(uint *)&pAVar7->field_0x14 =
             *(uint *)&pAVar7->field_0x14 & 0xffffffbf | (uVar3 >> 6 & 1) << 6;
      }
    }
  }
  if (local_30 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcLatch.c"
                  ,0x2f5,"int Abc_NtkVerifyCex(Abc_Ntk_t *, Abc_Cex_t *)");
  }
  k = -1;
  iBit = 0;
  do {
    iVar1 = Abc_NtkPoNum(pNtk);
    if (iVar1 <= iBit) {
LAB_00b02080:
      Abc_NtkCleanMarkC(pNtk);
      return k;
    }
    pAVar7 = Abc_NtkPo(pNtk,iBit);
    if ((*(uint *)&pAVar7->field_0x14 >> 6 & 1) != 0) {
      k = iBit;
      goto LAB_00b02080;
    }
    iBit = iBit + 1;
  } while( true );
}

Assistant:

int Abc_NtkVerifyCex( Abc_Ntk_t * pNtk, Abc_Cex_t * p )
{
    Abc_Obj_t * pObj;
    int RetValue, i, k, iBit = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( p->nPis  == Abc_NtkPiNum(pNtk) );
//    assert( p->nRegs == Abc_NtkLatchNum(pNtk) );
    Abc_NtkCleanMarkC( pNtk );
    Abc_AigConst1(pNtk)->fMarkC = 1;
    // initialize flops
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->fMarkC = Abc_InfoHasBit(p->pData, iBit++);
    // simulate timeframes
    iBit = p->nRegs;
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Abc_NtkForEachPi( pNtk, pObj, k )
            pObj->fMarkC = Abc_InfoHasBit(p->pData, iBit++);
        Abc_NtkForEachNode( pNtk, pObj, k )
            pObj->fMarkC = (Abc_ObjFanin0(pObj)->fMarkC ^ Abc_ObjFaninC0(pObj)) & 
                           (Abc_ObjFanin1(pObj)->fMarkC ^ Abc_ObjFaninC1(pObj));
        Abc_NtkForEachCo( pNtk, pObj, k )
            pObj->fMarkC = Abc_ObjFanin0(pObj)->fMarkC ^ Abc_ObjFaninC0(pObj);
        Abc_NtkForEachLatch( pNtk, pObj, k )
            Abc_ObjFanout0(pObj)->fMarkC = Abc_ObjFanin0(pObj)->fMarkC;
    }
    assert( iBit == p->nBits );
    // figure out the number of failed output
    RetValue = -1;
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( pObj->fMarkC )
        {
            RetValue = i;
            break;
        }
    }
    Abc_NtkCleanMarkC( pNtk );
    return RetValue;
}